

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.h
# Opt level: O0

void __thiscall
CTestResource::SetTileFlag_Custom
          (CTestResource *this,GMM_RESCREATE_CUSTOM_PARAMS *Params,TEST_TILE_TYPE Tile)

{
  TEST_TILE_TYPE Tile_local;
  GMM_RESCREATE_CUSTOM_PARAMS *Params_local;
  CTestResource *this_local;
  
  switch(Tile) {
  case TEST_LINEAR:
    (Params->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(Params->Flags).Info & 0xfffffffffff7ffff | 0x80000);
    break;
  case TEST_TILEX:
    (Params->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(Params->Flags).Info & 0xfffffff7ffffffff | 0x800000000);
    break;
  case TEST_TILEY:
    if ((*(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 >> 6 & 1) == 0) {
      (Params->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(Params->Flags).Info & 0xfffff7ffffffffff | 0x80000000000);
    }
    else {
      (Params->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(Params->Flags).Info & 0xffffffefffffffff | 0x1000000000);
    }
    break;
  case TEST_TILEYS:
    if ((*(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 >> 6 & 1) == 0) {
      (Params->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(Params->Flags).Info & 0xffffefffffffffff | 0x100000000000);
    }
    else {
      (Params->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(Params->Flags).Info & 0xffffffefffffffff | 0x1000000000);
      (Params->Flags).Info =
           (anon_struct_8_44_94931171_for_Info)
           ((ulong)(Params->Flags).Info & 0xffffffbfffffffff | 0x4000000000);
    }
    break;
  case TEST_TILEYF:
    (Params->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(Params->Flags).Info & 0xffffffefffffffff | 0x1000000000);
    (Params->Flags).Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(Params->Flags).Info & 0xffffffdfffffffff | 0x2000000000);
  }
  return;
}

Assistant:

void SetTileFlag_Custom(GMM_RESCREATE_CUSTOM_PARAMS& Params, TEST_TILE_TYPE Tile)
    {
        switch (Tile)
        {
        case TEST_LINEAR:
            Params.Flags.Info.Linear = 1;
            break;
        case TEST_TILEX:
            Params.Flags.Info.TiledX = 1;
            break;
        case TEST_TILEY:
            if (pGfxAdapterInfo->SkuTable.FtrTileY)
            {
                Params.Flags.Info.TiledY = 1;
            }
            else
            {
                Params.Flags.Info.Tile4 = 1;
            }
            break;
        case TEST_TILEYF:
            Params.Flags.Info.TiledY = 1;
            Params.Flags.Info.TiledYf = 1;
            break;
        case TEST_TILEYS:
            if (pGfxAdapterInfo->SkuTable.FtrTileY)
            {
                Params.Flags.Info.TiledY  = 1;
                Params.Flags.Info.TiledYs = 1;
            }
            else
            {
                Params.Flags.Info.Tile64 = 1;
            }
            break;
        default:
            break;
        }
    }